

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O3

bool __thiscall r_exec::HLPOverlay::scan_bwd_guards(HLPOverlay *this)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  ushort uVar5;
  uint16_t uVar6;
  ulong uVar7;
  bool bVar8;
  Atom a;
  undefined4 local_3c;
  ulong local_38;
  
  uVar5 = r_code::Atom::asIndex();
  local_38 = (ulong)uVar5;
  bVar2 = r_code::Atom::getAtomCount();
  if (bVar2 != 0) {
    uVar7 = 1;
    bVar8 = false;
    do {
      local_3c = *(undefined4 *)
                  ((this->super_Overlay).code + (ulong)((int)local_38 + (int)uVar7 & 0xffff) * 4);
      cVar3 = r_code::Atom::getDescriptor();
      if (cVar3 == -0x7c) {
        uVar6 = r_code::Atom::asIndex();
        bVar4 = scan_location(this,uVar6);
LAB_00176899:
        if (bVar4 == false) {
          r_code::Atom::~Atom((Atom *)&local_3c);
          return bVar8;
        }
      }
      else if (cVar3 == -0x73) {
        uVar6 = r_code::Atom::asIndex();
        bVar4 = scan_location(this,uVar6);
        goto LAB_00176899;
      }
      r_code::Atom::~Atom((Atom *)&local_3c);
      bVar8 = bVar2 <= uVar7;
      lVar1 = (1 - (ulong)bVar2) + uVar7;
      uVar7 = uVar7 + 1;
    } while (lVar1 != 1);
  }
  return true;
}

Assistant:

bool HLPOverlay::scan_bwd_guards()
{
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        switch (a.getDescriptor()) {
        case Atom::I_PTR:
            if (!scan_location(a.asIndex())) {
                return false;
            }

            break;

        case Atom::ASSIGN_PTR:
            if (!scan_location(a.asIndex())) {
                return false;
            }

            break;
        }
    }

    return true;
}